

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

string * __thiscall
QPDFObjectHandle::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  element_type *peVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  string local_38;
  QPDFObjGen local_18;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) || ((peVar1->og).obj == 0)) {
    unparseResolved_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    if (peVar1 == (element_type *)0x0) {
      local_18.obj = 0;
      local_18.gen = 0;
    }
    else {
      local_18 = peVar1->og;
    }
    QPDFObjGen::unparse_abi_cxx11_(&local_38,&local_18,' ');
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::unparse() const
{
    if (this->isIndirect()) {
        return getObjGen().unparse(' ') + " R";
    } else {
        return unparseResolved();
    }
}